

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

Role __thiscall QAccessibleToolButton::role(QAccessibleToolButton *this)

{
  bool bVar1;
  ToolButtonPopupMode TVar2;
  QToolButton *this_00;
  QMenu *pQVar3;
  QToolButton *tb;
  QAbstractButton *ab;
  QToolButton *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  QAccessibleButton::button((QAccessibleButton *)0x7ee9d7);
  this_00 = qobject_cast<QToolButton*>((QObject *)0x7ee9e6);
  pQVar3 = QToolButton::menu(in_stack_ffffffffffffffd8);
  if (pQVar3 == (QMenu *)0x0) {
    bVar1 = QAbstractButton::isCheckable(&this_00->super_QAbstractButton);
    local_4 = Button;
    if (bVar1) {
      local_4 = CheckBox;
    }
  }
  else {
    TVar2 = QToolButton::popupMode(this_00);
    if (TVar2 == DelayedPopup) {
      local_4 = ButtonDropDown;
    }
    else {
      local_4 = ButtonMenu;
    }
  }
  return local_4;
}

Assistant:

QAccessible::Role QAccessibleToolButton::role() const
{
#if QT_CONFIG(menu)
    QAbstractButton *ab = button();
    QToolButton *tb = qobject_cast<QToolButton*>(ab);
    if (!tb->menu())
        return tb->isCheckable() ? QAccessible::CheckBox : QAccessible::PushButton;
    else if (tb->popupMode() == QToolButton::DelayedPopup)
        return QAccessible::ButtonDropDown;
#endif

    return QAccessible::ButtonMenu;
}